

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleStringCacheTest.cpp
# Opt level: O0

void __thiscall
TEST_SimpleStringInternalCache_allocationWillReuseTheAllocatedBlocks_Test::
TEST_SimpleStringInternalCache_allocationWillReuseTheAllocatedBlocks_Test
          (TEST_SimpleStringInternalCache_allocationWillReuseTheAllocatedBlocks_Test *this)

{
  TEST_SimpleStringInternalCache_allocationWillReuseTheAllocatedBlocks_Test *this_local;
  
  memset(this,0,0xa0);
  TEST_GROUP_CppUTestGroupSimpleStringInternalCache::
  TEST_GROUP_CppUTestGroupSimpleStringInternalCache
            (&this->super_TEST_GROUP_CppUTestGroupSimpleStringInternalCache);
  (this->super_TEST_GROUP_CppUTestGroupSimpleStringInternalCache).super_Utest._vptr_Utest =
       (_func_int **)
       &PTR__TEST_SimpleStringInternalCache_allocationWillReuseTheAllocatedBlocks_Test_003f70e0;
  return;
}

Assistant:

TEST(SimpleStringInternalCache, allocationWillReuseTheAllocatedBlocks)
{
    cache.setAllocator(allocator);

    char* mem = cache.alloc(10);
    cache.dealloc(mem, 10);
    mem = cache.alloc(10);
    cache.dealloc(mem, 10);

    LONGS_EQUAL(1, accountant.totalAllocationsOfSize(32));
}